

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O2

void loadAET(EdgeTableEntry *AET,EdgeTableEntry *ETEs)

{
  _EdgeTableEntry *p_Var1;
  EdgeTableEntry *pEVar2;
  EdgeTableEntry *pEVar3;
  EdgeTableEntry *pPrevAET;
  
  pEVar2 = AET->next;
  do {
    pEVar3 = ETEs;
    p_Var1 = pEVar2;
    if (pEVar3 == (EdgeTableEntry *)0x0) {
      return;
    }
    while (pEVar2 = p_Var1, pEVar2 != (EdgeTableEntry *)0x0) {
      if ((pEVar3->bres).minor_axis <= (pEVar2->bres).minor_axis) {
        ETEs = pEVar3->next;
        pEVar3->next = pEVar2;
        pEVar2->back = pEVar3;
        goto LAB_003d40a2;
      }
      AET = pEVar2;
      p_Var1 = pEVar2->next;
    }
    ETEs = pEVar3->next;
    pEVar3->next = (_EdgeTableEntry *)0x0;
LAB_003d40a2:
    pEVar3->back = AET;
    AET->next = pEVar3;
    AET = pEVar3;
  } while( true );
}

Assistant:

static void loadAET(EdgeTableEntry *AET, EdgeTableEntry *ETEs)
{
    EdgeTableEntry *pPrevAET;
    EdgeTableEntry *tmp;

    pPrevAET = AET;
    AET = AET->next;
    while (ETEs) {
        while (AET && AET->bres.minor_axis < ETEs->bres.minor_axis) {
            pPrevAET = AET;
            AET = AET->next;
        }
        tmp = ETEs->next;
        ETEs->next = AET;
        if (AET)
            AET->back = ETEs;
        ETEs->back = pPrevAET;
        pPrevAET->next = ETEs;
        pPrevAET = ETEs;

        ETEs = tmp;
    }
}